

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialBendType.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,PolynomialBendType *pbt)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  
  p_Var4 = (pbt->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pbt->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  cVar2 = (char)os;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"This PolynomialBendType contains nothing",0x28);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"This PolynomialBendType contains below terms:",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    while( true ) {
      poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"*",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(theta - ",9);
      poVar3 = std::ostream::_M_insert<double>((pbt->super_BendType).theta0_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"^",1);
      std::ostream::operator<<(poVar3,p_Var4[1]._M_color);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      if ((_Rb_tree_header *)p_Var4 == p_Var1) break;
      std::__ostream_insert<char,std::char_traits<char>>(os," + ",3);
    }
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, PolynomialBendType& pbt) {
    DoublePolynomial::const_iterator i;

    i = pbt.polynomial_.begin();

    if (i == pbt.polynomial_.end()) {
      os << "This PolynomialBendType contains nothing" << std::endl;
      return os;
    }

    os << "This PolynomialBendType contains below terms:" << std::endl;

    while (true) {
      os << i->second << "*"
         << "(theta - " << pbt.getTheta() << ")"
         << "^" << i->first;

      if (++i == pbt.polynomial_.end()) {
        // If we reach the end of the polynomial pair, write out a
        // newline and then escape the loop
        os << std::endl;
        break;
      } else {
        // otherwise, write out a "+"
        os << " + ";
      }
    }
    return os;
  }